

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrototypeChainCache.cpp
# Opt level: O0

bool __thiscall
Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>::CheckProtoChainInternal
          (PrototypeChainCache<Js::OnlyWritablePropertyCache> *this,RecyclableObject *prototype)

{
  code *pcVar1;
  bool bVar2;
  bool bVar3;
  TypeId TVar4;
  undefined4 *puVar5;
  Type *type;
  ScriptContext *pSVar6;
  ScriptContext *pSVar7;
  TypeId typeId;
  bool onlyOneScriptContext;
  ScriptContext *scriptContext;
  Type *originalType;
  RecyclableObject *prototype_local;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *this_local;
  
  if (prototype == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/PrototypeChainCache.cpp"
                                ,0xc0,"(prototype)","prototype");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  type = RecyclableObject::GetType(prototype);
  pSVar6 = RecyclableObject::GetScriptContext(prototype);
  bVar2 = true;
  originalType = (Type *)prototype;
  while( true ) {
    TVar4 = RecyclableObject::GetTypeId((RecyclableObject *)originalType);
    if (TVar4 == TypeIds_Null) {
      if (bVar2) {
        OnlyWritablePropertyCache::Cache(type);
      }
      return true;
    }
    if (TVar4 == TypeIds_Proxy) break;
    pSVar7 = RecyclableObject::GetScriptContext((RecyclableObject *)originalType);
    if (pSVar7 != pSVar6) {
      bVar2 = false;
    }
    bVar3 = OnlyWritablePropertyCache::CheckObject((RecyclableObject *)originalType);
    if (!bVar3) {
      return false;
    }
    originalType = (Type *)RecyclableObject::GetPrototype((RecyclableObject *)originalType);
  }
  return false;
}

Assistant:

bool
PrototypeChainCache<T>::CheckProtoChainInternal(RecyclableObject* prototype)
{
    Assert(prototype);

    Type *const originalType = prototype->GetType();
    ScriptContext *const scriptContext = prototype->GetScriptContext();

    bool onlyOneScriptContext = true;
    TypeId typeId;
    for (; (typeId = prototype->GetTypeId()) != TypeIds_Null; prototype = prototype->GetPrototype())
    {
        if (typeId == TypeIds_Proxy)
        {
            return false;
        }
        if (prototype->GetScriptContext() != scriptContext)
        {
            onlyOneScriptContext = false;
        }
        if (!T::CheckObject(prototype))
        {
            return false;
        }
    }

    if (onlyOneScriptContext)
    {
        // Technically, we could register all prototypes in the chain but this is good enough for now
        T::Cache(originalType);
    }

    return true;
}